

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::Config::splitPages(Config *this,string *parameter)

{
  ulong uVar1;
  char *str;
  element_type *peVar2;
  int local_2c;
  int n;
  string *parameter_local;
  Config *this_local;
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    str = (char *)std::__cxx11::string::c_str();
    local_2c = QUtil::string_to_int(str);
  }
  else {
    local_2c = 1;
  }
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->o);
  peVar2->split_pages = local_2c;
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::splitPages(std::string const& parameter)
{
    int n = (parameter.empty() ? 1 : QUtil::string_to_int(parameter.c_str()));
    o.m->split_pages = n;
    return this;
}